

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualRow.cpp
# Opt level: O0

void __thiscall HDualRow::choose_final(HDualRow *this)

{
  reference pvVar1;
  double *pdVar2;
  size_type sVar3;
  reference pvVar4;
  long *in_RDI;
  pair<int,_double> pVar5;
  int move;
  int iCol_3;
  int i_4;
  int sourceOut;
  int iCol_2;
  int jCol;
  int i_3;
  int iMaxFinal;
  double dMaxFinal;
  int iGroup;
  int breakIndex;
  int breakGroup;
  int countGroup;
  int i_2;
  double finalCompare;
  double dual;
  double value;
  int iCol_1;
  int i_1;
  double remainTheta;
  double Td;
  double tight;
  double alpha;
  int iCol;
  int i;
  double selectTheta;
  double totalDelta;
  double totalChange;
  int fullCount;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int iVar6;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  in_stack_fffffffffffffed8;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  in_stack_fffffffffffffee0;
  pair<int,_double> local_d8;
  undefined4 local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  pair<int,_double> *local_a8;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  double local_90;
  double local_88;
  int local_7c;
  double local_78;
  double local_70;
  double local_68;
  int local_60;
  int local_5c;
  double local_58;
  undefined4 local_4c;
  double local_48;
  double local_40;
  double local_38;
  int local_30;
  int local_2c;
  double local_28;
  double local_20;
  double local_18;
  int local_c;
  
  HTimer::recordStart((HTimer *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                      in_stack_fffffffffffffecc);
  local_c = *(int *)((long)in_RDI + 0xb4);
  *(undefined4 *)((long)in_RDI + 0xb4) = 0;
  local_18 = 0.0;
  local_20 = ABS((double)in_RDI[0x13]);
  local_28 = (double)in_RDI[0x15] * 10.0 + 1e-07;
  do {
    for (local_2c = *(int *)((long)in_RDI + 0xb4); local_2c < local_c; local_2c = local_2c + 1) {
      pvVar1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
               operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           *)(in_RDI + 0x17),(long)local_2c);
      local_30 = pvVar1->first;
      pvVar1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
               operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           *)(in_RDI + 0x17),(long)local_2c);
      local_38 = pvVar1->second;
      local_40 = (double)*(int *)(in_RDI[3] + (long)local_30 * 4) *
                 *(double *)(in_RDI[4] + (long)local_30 * 8);
      if (local_40 <= local_38 * local_28) {
        iVar6 = *(int *)((long)in_RDI + 0xb4);
        *(int *)((long)in_RDI + 0xb4) = iVar6 + 1;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   (in_RDI + 0x17),(long)iVar6);
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   (in_RDI + 0x17),(long)local_2c);
        std::swap<int,double>
                  ((pair<int,_double> *)
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (pair<int,_double> *)
                   CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        local_18 = *(double *)(in_RDI[5] + (long)local_30 * 8) * local_38 + local_18;
      }
    }
    local_28 = local_28 * 10.0;
  } while ((local_18 < local_20) && (*(int *)((long)in_RDI + 0xb4) != local_c));
  HTimer::recordFinish
            ((HTimer *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffecc);
  HTimer::recordStart((HTimer *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                      in_stack_fffffffffffffecc);
  local_48 = *(double *)(*in_RDI + 0x30);
  local_c = *(int *)((long)in_RDI + 0xb4);
  *(undefined4 *)((long)in_RDI + 0xb4) = 0;
  local_18 = 1e-12;
  local_28 = (double)in_RDI[0x15];
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x155631);
  local_4c = 0;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (value_type *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  while (local_28 < 1e+18) {
    local_58 = 1e+100;
    for (local_5c = *(int *)((long)in_RDI + 0xb4); local_5c < local_c; local_5c = local_5c + 1) {
      pvVar1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
               operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           *)(in_RDI + 0x17),(long)local_5c);
      local_60 = pvVar1->first;
      pvVar1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
               operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           *)(in_RDI + 0x17),(long)local_5c);
      local_68 = pvVar1->second;
      local_70 = (double)*(int *)(in_RDI[3] + (long)local_60 * 4) *
                 *(double *)(in_RDI[4] + (long)local_60 * 8);
      if (local_28 * local_68 < local_70) {
        if (local_70 + local_48 < local_58 * local_68) {
          local_58 = (local_70 + local_48) / local_68;
        }
      }
      else {
        iVar6 = *(int *)((long)in_RDI + 0xb4);
        *(int *)((long)in_RDI + 0xb4) = iVar6 + 1;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   (in_RDI + 0x17),(long)iVar6);
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   (in_RDI + 0x17),(long)local_5c);
        std::swap<int,double>
                  ((pair<int,_double> *)
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (pair<int,_double> *)
                   CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        local_18 = local_68 * *(double *)(in_RDI[5] + (long)local_60 * 8) + local_18;
      }
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee0._M_current,
               &(in_stack_fffffffffffffed8._M_current)->first);
    local_28 = local_58;
    if ((local_20 <= local_18) || (*(int *)((long)in_RDI + 0xb4) == local_c)) break;
  }
  local_78 = 0.0;
  for (local_7c = 0; local_7c < *(int *)((long)in_RDI + 0xb4); local_7c = local_7c + 1) {
    pvVar1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
             operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                        (in_RDI + 0x17),(long)local_7c);
    pdVar2 = std::max<double>(&local_78,&pvVar1->second);
    local_78 = *pdVar2;
  }
  local_88 = local_78 * 0.1;
  local_90 = 1.0;
  pdVar2 = std::min<double>(&local_88,&local_90);
  local_78 = *pdVar2;
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1a));
  local_94 = (int)sVar3 + -1;
  local_98 = -1;
  local_9c = -1;
  local_a0 = (int)sVar3 + -2;
  do {
    if (local_a0 < 0) {
LAB_00155bb9:
      local_bc = 1;
      if ((double)in_RDI[0x13] < 0.0) {
        local_bc = -1;
      }
      pvVar1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
               operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           *)(in_RDI + 0x17),(long)local_9c);
      *(int *)(in_RDI + 0x16) = pvVar1->first;
      pvVar1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
               operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           *)(in_RDI + 0x17),(long)local_9c);
      in_RDI[0x14] = (long)(pvVar1->second * (double)local_bc *
                           (double)*(int *)(in_RDI[3] + (long)(int)in_RDI[0x16] * 4));
      if (*(double *)(in_RDI[4] + (long)(int)in_RDI[0x16] * 8) *
          (double)*(int *)(in_RDI[3] + (long)(int)in_RDI[0x16] * 4) <= 0.0) {
        in_RDI[0x15] = 0;
      }
      else {
        in_RDI[0x15] = (long)(*(double *)(in_RDI[4] + (long)(int)in_RDI[0x16] * 8) /
                             (double)in_RDI[0x14]);
      }
      local_c = local_9c;
      *(undefined4 *)((long)in_RDI + 0xb4) = 0;
      local_c0 = 0;
      while (iVar6 = local_c0,
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1a),(long)local_98)
            , iVar6 < *pvVar4) {
        pvVar1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                 operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             *)(in_RDI + 0x17),(long)local_c0);
        local_c4 = pvVar1->first;
        local_c8 = *(undefined4 *)(in_RDI[3] + (long)local_c4 * 4);
        pVar5 = std::make_pair<int_const&,double>
                          ((int *)CONCAT44(iVar6,in_stack_fffffffffffffed0),
                           (double *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        local_d8.second = pVar5.second;
        local_d8.first = pVar5.first;
        iVar6 = *(int *)((long)in_RDI + 0xb4);
        *(int *)((long)in_RDI + 0xb4) = iVar6 + 1;
        pvVar1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                 operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             *)(in_RDI + 0x17),(long)iVar6);
        std::pair<int,_double>::operator=(pvVar1,&local_d8);
        local_c0 = local_c0 + 1;
      }
      if (((double)in_RDI[0x15] == 0.0) && (!NAN((double)in_RDI[0x15]))) {
        *(undefined4 *)((long)in_RDI + 0xb4) = 0;
      }
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
                ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
                ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      __gnu_cxx::
      __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
      ::operator+((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                   *)in_stack_fffffffffffffed8._M_current,CONCAT44(iVar6,in_stack_fffffffffffffed0))
      ;
      std::
      sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>>
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      HTimer::recordFinish
                ((HTimer *)CONCAT44(iVar6,in_stack_fffffffffffffed0),in_stack_fffffffffffffecc);
      return;
    }
    local_a8 = (pair<int,_double> *)0x0;
    local_ac = -1;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1a),(long)local_a0);
    for (local_b0 = *pvVar4; iVar6 = local_b0,
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1a),
                            (long)(local_a0 + 1)), iVar6 < *pvVar4; local_b0 = local_b0 + 1) {
      in_stack_fffffffffffffee0._M_current = local_a8;
      pvVar1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
               operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           *)(in_RDI + 0x17),(long)local_b0);
      if (pvVar1->second <= (double)in_stack_fffffffffffffee0._M_current) {
        in_stack_fffffffffffffed8._M_current = local_a8;
        pvVar1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                 operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             *)(in_RDI + 0x17),(long)local_b0);
        if (((double)in_stack_fffffffffffffed8._M_current == pvVar1->second) &&
           (!NAN((double)in_stack_fffffffffffffed8._M_current) && !NAN(pvVar1->second))) {
          pvVar1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                   operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                               *)(in_RDI + 0x17),(long)local_ac);
          local_b4 = pvVar1->first;
          pvVar1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                   operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                               *)(in_RDI + 0x17),(long)local_b0);
          local_b8 = pvVar1->first;
          if (*(int *)(in_RDI[2] + (long)local_b8 * 4) < *(int *)(in_RDI[2] + (long)local_b4 * 4)) {
            local_ac = local_b0;
          }
        }
      }
      else {
        pvVar1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                 operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             *)(in_RDI + 0x17),(long)local_b0);
        local_a8 = (pair<int,_double> *)pvVar1->second;
        local_ac = local_b0;
      }
    }
    pvVar1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
             operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                        (in_RDI + 0x17),(long)local_ac);
    if (local_78 < pvVar1->second) {
      local_9c = local_ac;
      local_98 = local_a0;
      goto LAB_00155bb9;
    }
    local_a0 = local_a0 + -1;
  } while( true );
}

Assistant:

void HDualRow::choose_final() {
    /**
     * This routine choose the dual entering variable by
     * BFRT and EXPAND. (In sequential)
     *
     * It will
     * (1) reduce the candidates as a small collection
     * (2) choose by BFRT by going over break points
     * (3) choose final by alpha
     * (4) determine final flip variables
     */

    // 1. Reduce by large step BFRT
    workModel->timer.recordStart(HTICK_CHUZC2);
    int fullCount = workCount;
    workCount = 0;
    double totalChange = 0;
    double totalDelta = fabs(workDelta);
    double selectTheta = 10 * workTheta + 1e-7;
    for (;;) {
        for (int i = workCount; i < fullCount; i++) {
            int iCol = workData[i].first;
            double alpha = workData[i].second;
            double tight = workMove[iCol] * workDual[iCol];
            if (alpha * selectTheta >= tight) {
                swap(workData[workCount++], workData[i]);
                totalChange += workRange[iCol] * alpha;
            }
        }
        selectTheta *= 10;
        if (totalChange >= totalDelta || workCount == fullCount)
            break;
    }
    workModel->timer.recordFinish(HTICK_CHUZC2);

    // 2. Choose by small step BFRT
    workModel->timer.recordStart(HTICK_CHUZC3);
    const double Td = workModel->dblOption[DBLOPT_DUAL_TOL];
    fullCount = workCount;
    workCount = 0;
    totalChange = 1e-12;
    selectTheta = workTheta;
    workGroup.clear();
    workGroup.push_back(0);
    while (selectTheta < 1e18) {
        double remainTheta = 1e100;
        for (int i = workCount; i < fullCount; i++) {
            int iCol = workData[i].first;
            double value = workData[i].second;
            double dual = workMove[iCol] * workDual[iCol];
            // Tight satisfy
            if (dual <= selectTheta * value) {
                swap(workData[workCount++], workData[i]);
                totalChange += value * (workRange[iCol]);
            } else if (dual + Td < remainTheta * value) {
                remainTheta = (dual + Td) / value;
            }
        }
        workGroup.push_back(workCount);
        selectTheta = remainTheta;
        if (totalChange >= totalDelta || workCount == fullCount)
            break;
    }

    // 3. Choose large alpha
    double finalCompare = 0;
    for (int i = 0; i < workCount; i++)
        finalCompare = max(finalCompare, workData[i].second);
    finalCompare = min(0.1 * finalCompare, 1.0);
    int countGroup = workGroup.size() - 1;
    int breakGroup = -1;
    int breakIndex = -1;
    for (int iGroup = countGroup - 1; iGroup >= 0; iGroup--) {
        double dMaxFinal = 0;
        int iMaxFinal = -1;
        for (int i = workGroup[iGroup]; i < workGroup[iGroup + 1]; i++) {
            if (dMaxFinal < workData[i].second) {
                dMaxFinal = workData[i].second;
                iMaxFinal = i;
            } else if (dMaxFinal == workData[i].second) {
                int jCol = workData[iMaxFinal].first;
                int iCol = workData[i].first;
                if (workRand[iCol] < workRand[jCol]) {
                    iMaxFinal = i;
                }
            }
        }

        if (workData[iMaxFinal].second > finalCompare) {
            breakIndex = iMaxFinal;
            breakGroup = iGroup;
            break;
        }

    }

    int sourceOut = workDelta < 0 ? -1 : 1;
    workPivot = workData[breakIndex].first;
    workAlpha = workData[breakIndex].second * sourceOut * workMove[workPivot];
    if (workDual[workPivot] * workMove[workPivot] > 0)
        workTheta = workDual[workPivot] / workAlpha;
    else
        workTheta = 0;

    // 4. Determine BFRT flip index: flip all
    fullCount = breakIndex;
    workCount = 0;
    for (int i = 0; i < workGroup[breakGroup]; i++) {
        const int iCol = workData[i].first;
        const int move = workMove[iCol];
        workData[workCount++] = make_pair(iCol, move * workRange[iCol]);
    }
    if (workTheta == 0)
        workCount = 0;
    sort(workData.begin(), workData.begin() + workCount);
    workModel->timer.recordFinish(HTICK_CHUZC3);
}